

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

int * __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::VarUsageRef(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *this,int i)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  piVar4 = (this->refcnt_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar1 = (long)(this->refcnt_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar4;
  uVar2 = lVar1 >> 2;
  if (uVar2 <= (ulong)(long)i) {
    auVar5._8_4_ = (int)(lVar1 >> 0x22);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    uVar3 = (ulong)(int)((ulong)((long)(this->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3);
    dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.4;
    uVar2 = (ulong)dVar6;
    uVar2 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    if (uVar2 < uVar3) {
      uVar2 = uVar3;
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->refcnt_vars_,uVar2);
    piVar4 = (this->refcnt_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  return piVar4 + i;
}

Assistant:

int& VarUsageRef(int i) {
		assert(i>=0 && i<num_vars());
		if ((size_t)i>=refcnt_vars_.size())
			refcnt_vars_.resize(
						std::max((size_t)num_vars(),
										 (size_t)(refcnt_vars_.size()*1.4)));
		return refcnt_vars_[i];
	}